

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O0

u32string * __thiscall
peg::decode_abi_cxx11_(u32string *__return_storage_ptr__,peg *this,char *s8,size_t l)

{
  size_t sVar1;
  char32_t __c;
  bool bVar2;
  size_t beg;
  size_t i;
  size_t l_local;
  char *s8_local;
  u32string *out;
  
  std::__cxx11::u32string::u32string((u32string *)__return_storage_ptr__);
  beg = 0;
  while (sVar1 = beg, beg < s8) {
    do {
      beg = beg + 1;
      bVar2 = false;
      if (beg < s8) {
        bVar2 = ((int)(char)this[beg] & 0xc0U) == 0x80;
      }
    } while (bVar2);
    __c = decode_codepoint((char *)(this + sVar1),beg - sVar1);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    operator+=(__return_storage_ptr__,__c);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::u32string decode(const char *s8, size_t l) {
  std::u32string out;
  size_t i = 0;
  while (i < l) {
    auto beg = i++;
    while (i < l && (s8[i] & 0xc0) == 0x80) {
      i++;
    }
    out += decode_codepoint(&s8[beg], (i - beg));
  }
  return out;
}